

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::DoubleAPFloat::addImpl
          (DoubleAPFloat *this,APFloat *a,APFloat *aa,APFloat *c,APFloat *cc,roundingMode RM)

{
  IEEEFloat *this_00;
  byte bVar1;
  APFloat *pAVar2;
  bool bVar3;
  opStatus oVar4;
  cmpResult cVar5;
  opStatus oVar6;
  opStatus oVar7;
  opStatus oVar8;
  opStatus oVar9;
  opStatus oVar10;
  opStatus oVar11;
  opStatus oVar12;
  APFloat *pAVar13;
  Storage *pSVar14;
  undefined8 uVar15;
  Storage *pSVar16;
  APFloat z;
  APFloat q;
  APFloat zz;
  undefined1 local_90 [8];
  Storage local_88;
  undefined1 local_70 [8];
  Storage local_68;
  undefined1 local_50 [8];
  Storage local_48;
  
  pSVar16 = &a->U;
  if ((a->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
    DoubleAPFloat((DoubleAPFloat *)(local_90 + 8),(DoubleAPFloat *)&pSVar16->IEEE);
  }
  else {
    IEEEFloat::IEEEFloat((IEEEFloat *)(local_90 + 8),&pSVar16->IEEE);
  }
  oVar4 = APFloat::add((APFloat *)local_90,c,RM);
  uVar15 = local_90;
  if (local_88.semantics == (fltSemantics *)semPPCDoubleDouble) {
    uVar15 = local_88.IEEE.significand;
  }
  if ((*(byte *)(uVar15 + 0x1a) & 6) == 0) {
    if ((*(byte *)(uVar15 + 0x1a) & 1) != 0) {
      APFloat::Storage::operator=
                ((Storage *)
                 &(((this->Floats)._M_t.
                    super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t
                    .super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                    super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U).IEEE,
                 (Storage *)(local_90 + 8));
      APFloat::makeZero((this->Floats)._M_t.
                        super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                        .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,false);
      goto LAB_00176b4d;
    }
    cVar5 = APFloat::compareAbsoluteValue(a,c);
    APFloat::Storage::operator=((Storage *)&((Storage *)(local_90 + 8))->IEEE,&cc->U);
    oVar4 = APFloat::add((APFloat *)local_90,aa,RM);
    pAVar13 = c;
    pAVar2 = a;
    if (cVar5 == cmpGreaterThan) {
      pAVar13 = a;
      pAVar2 = c;
    }
    oVar6 = APFloat::add((APFloat *)local_90,pAVar2,RM);
    oVar7 = APFloat::add((APFloat *)local_90,pAVar13,RM);
    uVar15 = local_90;
    if (local_88.semantics == (fltSemantics *)semPPCDoubleDouble) {
      uVar15 = local_88.IEEE.significand;
    }
    oVar4 = oVar7 | oVar6 | oVar4;
    bVar1 = *(byte *)(uVar15 + 0x1a);
    pSVar14 = &((this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U;
    if ((bVar1 & 6) == 0) {
      APFloat::Storage::operator=((Storage *)&pSVar14->IEEE,(Storage *)(local_90 + 8));
      APFloat::makeZero((this->Floats)._M_t.
                        super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                        .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,false);
      oVar6 = oVar4;
    }
    else {
      APFloat::Storage::operator=((Storage *)&pSVar14->IEEE,(Storage *)(local_90 + 8));
      if ((aa->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
        DoubleAPFloat((DoubleAPFloat *)(local_70 + 8),(DoubleAPFloat *)&(aa->U).IEEE);
      }
      else {
        IEEEFloat::IEEEFloat((IEEEFloat *)(local_70 + 8),&(aa->U).IEEE);
      }
      oVar6 = APFloat::add((APFloat *)local_70,cc,RM);
      pSVar14 = &c->U;
      if (cVar5 == cmpGreaterThan) {
        a = c;
        pSVar14 = pSVar16;
      }
      APFloat::Storage::operator=
                ((Storage *)
                 &(this->Floats)._M_t.
                  super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                  super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U.IEEE,pSVar14);
      oVar7 = APFloat::subtract((this->Floats)._M_t.
                                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                                .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                                (APFloat *)local_90,RM);
      oVar8 = APFloat::add((this->Floats)._M_t.
                           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                           .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,a,RM);
      oVar9 = APFloat::add((this->Floats)._M_t.
                           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                           .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                           (APFloat *)local_70,RM);
      APFloat::Storage::~Storage((Storage *)(local_70 + 8));
      oVar6 = oVar9 | oVar6 | oVar8 | oVar7 | oVar4;
    }
    if ((bVar1 & 6) == 0) goto LAB_00176b4d;
  }
  else {
    this_00 = (IEEEFloat *)(local_70 + 8);
    if (pSVar16->semantics == (fltSemantics *)semPPCDoubleDouble) {
      DoubleAPFloat((DoubleAPFloat *)this_00,(DoubleAPFloat *)&pSVar16->IEEE);
    }
    else {
      IEEEFloat::IEEEFloat(this_00,&pSVar16->IEEE);
    }
    oVar6 = APFloat::subtract((APFloat *)local_70,(APFloat *)local_90,RM);
    if (local_68.semantics == (fltSemantics *)semPPCDoubleDouble) {
      DoubleAPFloat((DoubleAPFloat *)(local_50 + 8),(DoubleAPFloat *)this_00);
    }
    else {
      IEEEFloat::IEEEFloat((IEEEFloat *)(local_50 + 8),this_00);
    }
    oVar7 = APFloat::add((APFloat *)local_50,c,RM);
    oVar8 = APFloat::add((APFloat *)local_70,(APFloat *)local_90,RM);
    oVar9 = APFloat::subtract((APFloat *)local_70,a,RM);
    APFloat::changeSign((APFloat *)local_70);
    oVar10 = APFloat::add((APFloat *)local_50,(APFloat *)local_70,RM);
    oVar11 = APFloat::add((APFloat *)local_50,aa,RM);
    oVar12 = APFloat::add((APFloat *)local_50,cc,RM);
    uVar15 = local_50;
    if (local_48.semantics == (fltSemantics *)semPPCDoubleDouble) {
      uVar15 = local_48.IEEE.significand;
    }
    oVar6 = oVar11 | oVar10 | oVar12 | oVar9 | oVar8 | oVar6 | oVar7 | oVar4;
    pSVar14 = &((this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U;
    pSVar16 = (Storage *)(local_90 + 8);
    if ((*(byte *)(uVar15 + 0x1a) & 0xf) == 3) {
      APFloat::Storage::operator=((Storage *)&pSVar14->IEEE,pSVar16);
      bVar3 = false;
      APFloat::makeZero((this->Floats)._M_t.
                        super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                        .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,false);
      pSVar16 = (Storage *)0x0;
    }
    else {
      APFloat::Storage::operator=((Storage *)&pSVar14->IEEE,pSVar16);
      oVar4 = APFloat::add((this->Floats)._M_t.
                           super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                           .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl,
                           (APFloat *)local_50,RM);
      oVar6 = oVar6 | oVar4;
      pAVar2 = (this->Floats)._M_t.
               super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
               super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
               super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
      pAVar13 = (APFloat *)(pAVar2->U).IEEE.significand.part;
      if ((pAVar2->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
        pAVar13 = pAVar2;
      }
      if ((*(undefined1 *)((long)&pAVar13->U + 0x12) & 6) == 0) {
        bVar3 = false;
        APFloat::makeZero(pAVar2 + 1,false);
        pSVar16 = (Storage *)(ulong)oVar6;
      }
      else {
        APFloat::Storage::operator=((Storage *)&pAVar2[1].U.IEEE,pSVar16);
        pAVar2 = (this->Floats)._M_t.
                 super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                 super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                 super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
        oVar4 = APFloat::subtract(pAVar2 + 1,pAVar2,RM);
        oVar7 = APFloat::add((this->Floats)._M_t.
                             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                             .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                             (APFloat *)local_50,RM);
        oVar6 = oVar6 | oVar7 | oVar4;
        bVar3 = true;
      }
    }
    APFloat::Storage::~Storage((Storage *)(local_50 + 8));
    APFloat::Storage::~Storage((Storage *)(local_70 + 8));
    oVar4 = (opStatus)pSVar16;
    if (!bVar3) goto LAB_00176b4d;
  }
  oVar4 = oVar6;
LAB_00176b4d:
  APFloat::Storage::~Storage((Storage *)(local_90 + 8));
  return oVar4;
}

Assistant:

APFloat::opStatus DoubleAPFloat::addImpl(const APFloat &a, const APFloat &aa,
                                         const APFloat &c, const APFloat &cc,
                                         roundingMode RM) {
  int Status = opOK;
  APFloat z = a;
  Status |= z.add(c, RM);
  if (!z.isFinite()) {
    if (!z.isInfinity()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Status = opOK;
    auto AComparedToC = a.compareAbsoluteValue(c);
    z = cc;
    Status |= z.add(aa, RM);
    if (AComparedToC == APFloat::cmpGreaterThan) {
      // z = cc + aa + c + a;
      Status |= z.add(c, RM);
      Status |= z.add(a, RM);
    } else {
      // z = cc + aa + a + c;
      Status |= z.add(a, RM);
      Status |= z.add(c, RM);
    }
    if (!z.isFinite()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Floats[0] = z;
    APFloat zz = aa;
    Status |= zz.add(cc, RM);
    if (AComparedToC == APFloat::cmpGreaterThan) {
      // Floats[1] = a - z + c + zz;
      Floats[1] = a;
      Status |= Floats[1].subtract(z, RM);
      Status |= Floats[1].add(c, RM);
      Status |= Floats[1].add(zz, RM);
    } else {
      // Floats[1] = c - z + a + zz;
      Floats[1] = c;
      Status |= Floats[1].subtract(z, RM);
      Status |= Floats[1].add(a, RM);
      Status |= Floats[1].add(zz, RM);
    }
  } else {
    // q = a - z;
    APFloat q = a;
    Status |= q.subtract(z, RM);

    // zz = q + c + (a - (q + z)) + aa + cc;
    // Compute a - (q + z) as -((q + z) - a) to avoid temporary copies.
    auto zz = q;
    Status |= zz.add(c, RM);
    Status |= q.add(z, RM);
    Status |= q.subtract(a, RM);
    q.changeSign();
    Status |= zz.add(q, RM);
    Status |= zz.add(aa, RM);
    Status |= zz.add(cc, RM);
    if (zz.isZero() && !zz.isNegative()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return opOK;
    }
    Floats[0] = z;
    Status |= Floats[0].add(zz, RM);
    if (!Floats[0].isFinite()) {
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Floats[1] = std::move(z);
    Status |= Floats[1].subtract(Floats[0], RM);
    Status |= Floats[1].add(zz, RM);
  }
  return (opStatus)Status;
}